

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O2

int big_file_mpi_create_records
              (BigFile *bf,BigRecordType *rtype,char *mode,int Nfile,size_t *fsize,MPI_Comm comm)

{
  BigRecordField *pBVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  BigBlock block [1];
  
  lVar3 = 8;
  uVar4 = 0;
  do {
    if (rtype->nfield <= uVar4) {
      return 0;
    }
    if (*mode == 'a') {
      if ((mode[1] != '+') || (mode[2] != '\0')) goto LAB_00104dc8;
      iVar2 = big_file_mpi_open_block
                        (bf,block,*(char **)(rtype->fields->dtype + lVar3 + -0x10),comm);
      if (iVar2 != 0) {
        iVar2 = 0x24d;
        goto LAB_00104e4f;
      }
      iVar2 = big_block_mpi_grow(block,Nfile,fsize,comm);
      if (iVar2 != 0) {
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                        ,0x250);
        iVar2 = big_block_mpi_close(block,comm);
        if (iVar2 == 0) {
          return -1;
        }
        iVar2 = 0x25d;
        goto LAB_00104e4f;
      }
    }
    else {
      if (((*mode != 'w') || (mode[1] != '+')) || (mode[2] != '\0')) {
LAB_00104dc8:
        _big_file_raise("Mode string must be `a+` or `w+`, `%s` provided",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                        ,0x254,mode);
        return -1;
      }
      pBVar1 = rtype->fields;
      iVar2 = _big_file_mpi_create_block
                        (bf,block,*(char **)(pBVar1->dtype + lVar3 + -0x10),
                         pBVar1->dtype + lVar3 + -8,*(int *)(pBVar1->dtype + lVar3),Nfile,fsize,comm
                        );
      if (iVar2 != 0) {
        iVar2 = 0x249;
        goto LAB_00104e4f;
      }
    }
    iVar2 = big_block_mpi_close(block,comm);
    if (iVar2 != 0) {
      iVar2 = 600;
LAB_00104e4f:
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-mpi.c"
                      ,iVar2);
      return -1;
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x20;
  } while( true );
}

Assistant:

int
big_file_mpi_create_records(BigFile * bf,
    const BigRecordType * rtype,
    const char * mode,
    int Nfile,
    const size_t fsize[],
    MPI_Comm comm)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigBlock block[1];
        if (0 == strcmp(mode, "w+")) {
            RAISEIF(0 != _big_file_mpi_create_block(bf, block,
                             rtype->fields[i].name,
                             rtype->fields[i].dtype,
                             rtype->fields[i].nmemb,
                             Nfile,
                             fsize,
                             comm),
                ex_open,
                NULL);
        } else if (0 == strcmp(mode, "a+")) {
            RAISEIF(0 != big_file_mpi_open_block(bf, block, rtype->fields[i].name, comm),
                ex_open,
                NULL);
            RAISEIF(0 != big_block_mpi_grow(block, Nfile, fsize, comm),
                ex_grow,
                NULL);
        } else {
            RAISE(ex_open,
                "Mode string must be `a+` or `w+`, `%s` provided",
                mode);
        }
        RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
        continue;
        ex_grow:
            RAISEIF(0 != big_block_mpi_close(block, comm),
            ex_close,
            NULL);
            return -1;
        ex_open:
        ex_close:
            return -1;
    }
    return 0;
}